

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

void __thiscall
MetricsDiscovery::MDHelper::PrintMetricValues
          (MDHelper *this,ostream *os,string *name,uint32_t numResults,
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          *results,vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                   *maxValues,
          vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
          *ioInfoValues)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  MDHelper *pMVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_68;
  
  if ((((this->m_Initialized == true) && (this->m_ConcurrentGroup != (IConcurrentGroupLatest *)0x0))
      && (this->m_MetricSet != (IMetricSetLatest *)0x0)) &&
     (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0)) {
    lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
    uVar1 = *(uint *)(lVar4 + 0x20);
    lVar4 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
    if (numResults != 0) {
      uVar2 = *(uint *)(lVar4 + 0x24);
      iVar3 = uVar2 + uVar1;
      uVar10 = 0;
      uVar8 = 0;
      uVar6 = 0;
      local_68 = uVar1;
      do {
        pMVar5 = (MDHelper *)
                 std::__ostream_insert<char,std::char_traits<char>>
                           (os,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar5,",",1);
        uVar9 = uVar10;
        uVar11 = (ulong)uVar1;
        uVar7 = uVar8;
        if (uVar1 != 0) {
          do {
            PrintValue(pMVar5,os,
                       (results->
                       super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar9);
            if (this->m_IncludeMaxValues == true) {
              PrintValue(pMVar5,os,
                         (maxValues->
                         super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar7);
            }
            uVar7 = uVar7 + 1;
            uVar9 = (ulong)((int)uVar9 + 1);
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        pMVar5 = (MDHelper *)os;
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        uVar7 = local_68;
        for (uVar9 = (ulong)uVar2; uVar9 != 0; uVar9 = uVar9 - 1) {
          PrintValue(pMVar5,os,
                     (results->
                     super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar7);
          uVar7 = uVar7 + 1;
        }
        if ((this->m_APIMask & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
          pMVar5 = (MDHelper *)this->m_ConcurrentGroup;
          lVar4 = (**(code **)(pMVar5->OpenAdapterGroup + 0x10))();
          uVar7 = *(uint *)(lVar4 + 0x18);
          if ((ulong)uVar7 != 0) {
            lVar4 = 0;
            do {
              PrintValue(pMVar5,os,
                         (TTypedValueLatest *)
                         ((long)&((ioInfoValues->
                                  super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->ValueType + lVar4));
              lVar4 = lVar4 + 0x10;
            } while ((ulong)uVar7 << 4 != lVar4);
          }
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
        std::ostream::put((char)os);
        std::ostream::flush();
        uVar6 = uVar6 + 1;
        uVar8 = uVar8 + uVar1;
        uVar10 = (ulong)(uint)((int)uVar10 + iVar3);
        local_68 = local_68 + iVar3;
      } while (uVar6 != numResults);
    }
  }
  return;
}

Assistant:

void MDHelper::PrintMetricValues(
    std::ostream& os,
    const std::string& name,
    const uint32_t numResults,
    const std::vector<TTypedValueLatest>& results,
    const std::vector<TTypedValueLatest>& maxValues,
    const std::vector<TTypedValueLatest>& ioInfoValues )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet || !os.good() )
    {
        DebugPrint("Can't PrintMetricValues!\n");
        return;
    }

    const uint32_t metricsCount = m_MetricSet->GetParams()->MetricsCount;
    const uint32_t infoCount = m_MetricSet->GetParams()->InformationCount;

    const uint32_t resultsCount = metricsCount + infoCount;

    for( uint32_t result = 0; result < numResults; result++ )
    {
        os << name << ",";

        for( uint32_t i = 0; i < metricsCount; i++ )
        {
            PrintValue( os, results[ resultsCount * result + i ] );
            if( m_IncludeMaxValues )
            {
                PrintValue( os, maxValues[ metricsCount * result + i ] );
            }
        }

        os << ",";

        for( uint32_t i = 0; i < infoCount; i++ )
        {
            PrintValue( os, results[ resultsCount * result + metricsCount + i ] );
        }

        if( m_APIMask & API_TYPE_IOSTREAM )
        {
            os << ",";

            const uint32_t ioInfoCount =
                m_ConcurrentGroup->GetParams()->IoMeasurementInformationCount;
            for( uint32_t i = 0; i < ioInfoCount; i++ )
            {
                PrintValue( os, ioInfoValues[ i ] );
            }
        }

        os << std::endl;
    }
}